

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_eh.h
# Opt level: O0

uint64_t read_value(char encoding,uchar **data)

{
  dwarf_data_encoding dVar1;
  ulong local_28;
  uint64_t v;
  dwarf_data_encoding type;
  uchar **data_local;
  char encoding_local;
  
  dVar1 = get_encoding(encoding);
  switch(dVar1) {
  case 0:
    local_28 = *(ulong *)*data;
    *data = *data + 8;
    break;
  case DW_EH_PE_uleb128:
    local_28 = read_uleb128(data);
    break;
  case DW_EH_PE_udata2:
    local_28 = (ulong)*(ushort *)*data;
    *data = *data + 2;
    break;
  case DW_EH_PE_udata4:
    local_28 = (ulong)*(uint *)*data;
    *data = *data + 4;
    break;
  case DW_EH_PE_udata8:
    local_28 = *(ulong *)*data;
    *data = *data + 8;
    break;
  default:
    abort();
  case DW_EH_PE_sleb128:
    local_28 = read_sleb128(data);
    break;
  case DW_EH_PE_sdata2:
    local_28 = (ulong)*(short *)*data;
    *data = *data + 2;
    break;
  case DW_EH_PE_sdata4:
    local_28 = (ulong)*(int *)*data;
    *data = *data + 4;
    break;
  case DW_EH_PE_sdata8:
    local_28 = *(ulong *)*data;
    *data = *data + 8;
  }
  return local_28;
}

Assistant:

static uint64_t read_value(char encoding, unsigned char **data)
{
	enum dwarf_data_encoding type = get_encoding(encoding);
	uint64_t v;
	switch ((int)type)
	{
		// Read fixed-length types
#define READ(dwarf, type) \
		case dwarf:\
			v = (uint64_t)(*(type*)(*data));\
			*data += sizeof(type);\
			break;
		READ(DW_EH_PE_udata2, uint16_t)
		READ(DW_EH_PE_udata4, uint32_t)
		READ(DW_EH_PE_udata8, uint64_t)
		READ(DW_EH_PE_sdata2, int16_t)
		READ(DW_EH_PE_sdata4, int32_t)
		READ(DW_EH_PE_sdata8, int64_t)
		case DW_EH_PE_absptr:
			v = (uint64_t)(*(intptr_t*)(*data));
			*data += sizeof(intptr_t);
			break;
		//READ(DW_EH_PE_absptr, intptr_t)
#undef READ
		case DW_EH_PE_sleb128:
			v = read_sleb128(data);
			break;
		case DW_EH_PE_uleb128:
			v = read_uleb128(data);
			break;
		default: abort();
	}

	return v;
}